

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

ConstTokenOrSyntax * __thiscall
slang::syntax::CaseStatementSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,CaseStatementSyntax *this,size_t index)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar1;
  __index_type _Var2;
  NamedLabelSyntax *pNVar3;
  undefined4 uVar4;
  uint32_t uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  switch(index) {
  case 0:
    pNVar3 = (this->super_StatementSyntax).label;
    goto LAB_00209e23;
  case 1:
    pSVar1 = &(this->super_StatementSyntax).attributes;
    goto LAB_00209e47;
  case 2:
    uVar4._0_2_ = (this->uniqueOrPriority).kind;
    uVar4._2_1_ = (this->uniqueOrPriority).field_0x2;
    uVar4._3_1_ = (this->uniqueOrPriority).numFlags;
    uVar5 = (this->uniqueOrPriority).rawLen;
    uVar6 = *(undefined4 *)&(this->uniqueOrPriority).info;
    uVar7 = *(undefined4 *)((long)&(this->uniqueOrPriority).info + 4);
    break;
  case 3:
    uVar4._0_2_ = (this->caseKeyword).kind;
    uVar4._2_1_ = (this->caseKeyword).field_0x2;
    uVar4._3_1_ = (this->caseKeyword).numFlags;
    uVar5 = (this->caseKeyword).rawLen;
    uVar6 = *(undefined4 *)&(this->caseKeyword).info;
    uVar7 = *(undefined4 *)((long)&(this->caseKeyword).info + 4);
    break;
  case 4:
    uVar4._0_2_ = (this->openParen).kind;
    uVar4._2_1_ = (this->openParen).field_0x2;
    uVar4._3_1_ = (this->openParen).numFlags;
    uVar5 = (this->openParen).rawLen;
    uVar6 = *(undefined4 *)&(this->openParen).info;
    uVar7 = *(undefined4 *)((long)&(this->openParen).info + 4);
    break;
  case 5:
    pNVar3 = (NamedLabelSyntax *)(this->expr).ptr;
LAB_00209e23:
    *(NamedLabelSyntax **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         pNVar3;
LAB_00209e4a:
    _Var2 = '\x01';
    goto LAB_00209e4c;
  case 6:
    uVar4._0_2_ = (this->closeParen).kind;
    uVar4._2_1_ = (this->closeParen).field_0x2;
    uVar4._3_1_ = (this->closeParen).numFlags;
    uVar5 = (this->closeParen).rawLen;
    uVar6 = *(undefined4 *)&(this->closeParen).info;
    uVar7 = *(undefined4 *)((long)&(this->closeParen).info + 4);
    break;
  case 7:
    uVar4._0_2_ = (this->matchesOrInside).kind;
    uVar4._2_1_ = (this->matchesOrInside).field_0x2;
    uVar4._3_1_ = (this->matchesOrInside).numFlags;
    uVar5 = (this->matchesOrInside).rawLen;
    uVar6 = *(undefined4 *)&(this->matchesOrInside).info;
    uVar7 = *(undefined4 *)((long)&(this->matchesOrInside).info + 4);
    break;
  case 8:
    pSVar1 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
             &(this->items).super_SyntaxListBase;
LAB_00209e47:
    *(SyntaxNode **)
     &(__return_storage_ptr__->
      super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
      super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
      super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> =
         &(pSVar1->super_SyntaxListBase).super_SyntaxNode;
    goto LAB_00209e4a;
  case 9:
    uVar4._0_2_ = (this->endcase).kind;
    uVar4._2_1_ = (this->endcase).field_0x2;
    uVar4._3_1_ = (this->endcase).numFlags;
    uVar5 = (this->endcase).rawLen;
    uVar6 = *(undefined4 *)&(this->endcase).info;
    uVar7 = *(undefined4 *)((long)&(this->endcase).info + 4);
    break;
  default:
    parsing::Token::Token((Token *)__return_storage_ptr__);
    goto LAB_00209e32;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
    ).super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
    super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> = uVar4;
  *(uint32_t *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   4) = uVar5;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   8) = uVar6;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0xc) = uVar7;
LAB_00209e32:
  _Var2 = '\0';
LAB_00209e4c:
  *(__index_type *)
   ((long)&(__return_storage_ptr__->
           super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>).
           super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Copy_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>.
           super__Variant_storage_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> +
   0x10) = _Var2;
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax CaseStatementSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return label;
        case 1: return &attributes;
        case 2: return uniqueOrPriority;
        case 3: return caseKeyword;
        case 4: return openParen;
        case 5: return expr.get();
        case 6: return closeParen;
        case 7: return matchesOrInside;
        case 8: return &items;
        case 9: return endcase;
        default: return nullptr;
    }
}